

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O0

void QCoreApplication::removePostedEvents(QObject *receiver,int eventType)

{
  undefined1 *puVar1;
  int iVar2;
  Type TVar3;
  qsizetype qVar4;
  const_reference pQVar5;
  iterator o;
  iterator o_00;
  Type in_ESI;
  QObject *in_RDI;
  QList<QPostEvent> *this;
  long in_FS_OFFSET;
  QPostEvent *pe;
  qsizetype i;
  qsizetype j;
  qsizetype n;
  QThreadData *data;
  QPostEventListLocker locker;
  QVarLengthArray<QEvent_*,_256LL> events;
  undefined4 in_stack_fffffffffffff6f8;
  int in_stack_fffffffffffff6fc;
  QVarLengthArray<QEvent_*,_256LL> *in_stack_fffffffffffff700;
  QEvent **in_stack_fffffffffffff708;
  QVarLengthArray<QEvent_*,_256LL> *in_stack_fffffffffffff710;
  undefined4 in_stack_fffffffffffff740;
  undefined4 in_stack_fffffffffffff744;
  long local_888;
  long local_880;
  const_iterator local_850;
  QPostEvent *local_848;
  const_iterator local_840;
  undefined1 *local_838;
  undefined1 *local_830;
  undefined1 *local_828;
  QVarLengthArray<QEvent_*,_256LL> local_820;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_838 = &DAT_aaaaaaaaaaaaaaaa;
  local_830 = &DAT_aaaaaaaaaaaaaaaa;
  local_828 = &DAT_aaaaaaaaaaaaaaaa;
  QCoreApplicationPrivate::lockThreadPostEventList
            ((QObject *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
  puVar1 = local_838;
  if (in_RDI != (QObject *)0x0) {
    QObject::d_func((QObject *)0x340a85);
    iVar2 = QBasicAtomicInteger<int>::loadAcquire((QBasicAtomicInteger<int> *)0x340a91);
    if (iVar2 == 0) goto LAB_00340dd1;
  }
  memset(&local_820,0xaa,0x818);
  QVarLengthArray<QEvent_*,_256LL>::QVarLengthArray(&local_820);
  qVar4 = QList<QPostEvent>::size((QList<QPostEvent> *)(puVar1 + 0x18));
  local_880 = 0;
  for (local_888 = 0; local_888 < qVar4; local_888 = local_888 + 1) {
    pQVar5 = QList<QPostEvent>::at
                       ((QList<QPostEvent> *)in_stack_fffffffffffff700,
                        CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
    if ((((in_RDI == (QObject *)0x0) || (pQVar5->receiver == in_RDI)) &&
        (pQVar5->event != (QEvent *)0x0)) &&
       ((in_ESI == None || (TVar3 = QEvent::type(pQVar5->event), TVar3 == in_ESI)))) {
      QObject::d_func((QObject *)0x340bab);
      QBasicAtomicInteger<int>::fetchAndSubAcquire
                ((QBasicAtomicInteger<int> *)in_stack_fffffffffffff700,in_stack_fffffffffffff6fc);
      pQVar5->event->m_posted = false;
      QVarLengthArray<QEvent_*,_256LL>::append(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
      pQVar5->event = (QEvent *)0x0;
    }
    else if (*(int *)(puVar1 + 0x30) == 0) {
      if (local_888 != local_880) {
        QList<QPostEvent>::operator[]
                  ((QList<QPostEvent> *)in_stack_fffffffffffff700,
                   CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
        QList<QPostEvent>::operator[]
                  ((QList<QPostEvent> *)in_stack_fffffffffffff700,
                   CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
        qSwap<QPostEvent>((QPostEvent *)in_stack_fffffffffffff700,
                          (QPostEvent *)
                          CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
      }
      local_880 = local_880 + 1;
    }
  }
  if (*(int *)(puVar1 + 0x30) == 0) {
    this = (QList<QPostEvent> *)(puVar1 + 0x18);
    local_848 = (QPostEvent *)
                QList<QPostEvent>::begin((QList<QPostEvent> *)in_stack_fffffffffffff700);
    o = QList<QPostEvent>::iterator::operator+
                  ((iterator *)in_stack_fffffffffffff700,
                   CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
    QList<QPostEvent>::const_iterator::const_iterator(&local_840,o);
    o_00 = QList<QPostEvent>::end((QList<QPostEvent> *)in_stack_fffffffffffff700);
    QList<QPostEvent>::const_iterator::const_iterator(&local_850,o_00);
    QList<QPostEvent>::erase(this,(const_iterator)o.i,(const_iterator)o_00.i);
  }
  QCoreApplicationPrivate::QPostEventListLocker::unlock((QPostEventListLocker *)0x340da8);
  qDeleteAll<QVarLengthArray<QEvent*,256ll>>(in_stack_fffffffffffff700);
  QVarLengthArray<QEvent_*,_256LL>::~QVarLengthArray(in_stack_fffffffffffff700);
LAB_00340dd1:
  QCoreApplicationPrivate::QPostEventListLocker::~QPostEventListLocker
            ((QPostEventListLocker *)0x340dde);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCoreApplication::removePostedEvents(QObject *receiver, int eventType)
{
    auto locker = QCoreApplicationPrivate::lockThreadPostEventList(receiver);
    QThreadData *data = locker.threadData;

    // the QObject destructor calls this function directly.  this can
    // happen while the event loop is in the middle of posting events,
    // and when we get here, we may not have any more posted events
    // for this object.
    if (receiver && !receiver->d_func()->postedEvents.loadAcquire())
        return;

    //we will collect all the posted events for the QObject
    //and we'll delete after the mutex was unlocked
    QVarLengthArray<QEvent*> events;
    qsizetype n = data->postEventList.size();
    qsizetype j = 0;

    for (qsizetype i = 0; i < n; ++i) {
        const QPostEvent &pe = data->postEventList.at(i);

        if ((!receiver || pe.receiver == receiver)
            && (pe.event && (eventType == 0 || pe.event->type() == eventType))) {
            pe.receiver->d_func()->postedEvents.fetchAndSubAcquire(1);
            pe.event->m_posted = false;
            events.append(pe.event);
            const_cast<QPostEvent &>(pe).event = nullptr;
        } else if (!data->postEventList.recursion) {
            if (i != j)
                qSwap(data->postEventList[i], data->postEventList[j]);
            ++j;
        }
    }

#ifdef QT_DEBUG
    if (receiver && eventType == 0) {
        Q_ASSERT(!receiver->d_func()->postedEvents);
    }
#endif

    if (!data->postEventList.recursion) {
        // truncate list
        data->postEventList.erase(data->postEventList.begin() + j, data->postEventList.end());
    }

    locker.unlock();
    qDeleteAll(events);
}